

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3MapBlock(Parser *this,Texture *map)

{
  string *out;
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  byte *pbVar4;
  byte bVar5;
  Texture *fOut;
  bool bVar6;
  int local_22c;
  string temp;
  char *local_1c8 [4];
  ostream local_1a8 [376];
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  out = &map->mMapName;
  bVar6 = true;
  local_22c = 0;
  do {
    while( true ) {
      pbVar4 = (byte *)this->filePtr;
      bVar5 = *pbVar4;
      if (bVar5 != 0x2a) break;
      this->filePtr = (char *)(pbVar4 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_CLASS",9);
      if (bVar1) {
        temp._M_string_length = 0;
        *temp._M_dataplus._M_p = '\0';
        bVar2 = ParseString(this,&temp,"*MAP_CLASS");
        if (!bVar2) {
          SkipToNextToken(this);
        }
        bVar2 = std::operator!=(&temp,"Bitmap");
        if (bVar2) {
          bVar2 = std::operator!=(&temp,"Normal Bump");
          if (bVar2) {
            pLVar3 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[33]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,(char (*) [33])"ASE: Skipping unknown map type: ");
            std::operator<<(local_1a8,(string *)&temp);
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar3,local_1c8[0]);
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
LAB_003d8905:
            bVar6 = !bVar1;
          }
        }
      }
      else {
        if (bVar6) {
          bVar2 = TokenMatch<char_const>(&this->filePtr,"BITMAP",6);
          if (bVar2) {
            bVar6 = ParseString(this,out,"*BITMAP");
            if (!bVar6) {
              SkipToNextToken(this);
            }
            bVar6 = std::operator==(out,"None");
            if (bVar6) {
              pLVar3 = DefaultLogger::get();
              Logger::warn(pLVar3,"ASE: Skipping invalid map entry");
              std::__cxx11::string::assign((char *)out);
            }
            goto LAB_003d8905;
          }
        }
        bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_U_OFFSET",0xc);
        fOut = (Texture *)&map->mOffsetU;
        if (!bVar1) {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_V_OFFSET",0xc);
          fOut = (Texture *)&map->mOffsetV;
          if (!bVar1) {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_U_TILING",0xc);
            fOut = (Texture *)&map->mScaleU;
            if (!bVar1) {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_V_TILING",0xc);
              fOut = (Texture *)&map->mScaleV;
              if (!bVar1) {
                bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_ANGLE",9);
                fOut = (Texture *)&map->mRotation;
                if (!bVar1) {
                  bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_AMOUNT",10);
                  fOut = map;
                  if (!bVar1) {
                    pbVar4 = (byte *)this->filePtr;
                    bVar5 = *pbVar4;
                    break;
                  }
                }
              }
            }
          }
        }
        ParseLV4MeshFloat(this,&fOut->mTextureBlend);
      }
    }
    if ((bVar5 - 0xc < 2) || (bVar5 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003d8955;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar5 == 0x7b) {
        local_22c = local_22c + 1;
      }
      else if (bVar5 == 0x7d) {
        local_22c = local_22c + -1;
        if (local_22c == 0) {
          this->filePtr = (char *)(pbVar4 + 1);
          SkipToNextToken(this);
          std::__cxx11::string::~string((string *)&temp);
          return;
        }
      }
      else if (bVar5 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MAP_XXXXXX chunk (Level 3)");
      }
LAB_003d8955:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar4 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MapBlock(Texture& map)
{
    AI_ASE_PARSER_INIT();

    // ***********************************************************
    // *BITMAP should not be there if *MAP_CLASS is not BITMAP,
    // but we need to expect that case ... if the path is
    // empty the texture won't be used later.
    // ***********************************************************
    bool parsePath = true;
    std::string temp;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // type of map
            if (TokenMatch(filePtr,"MAP_CLASS" ,9))
            {
                temp.clear();
                if(!ParseString(temp,"*MAP_CLASS"))
                    SkipToNextToken();
                if (temp != "Bitmap" && temp != "Normal Bump")
                {
                    ASSIMP_LOG_WARN_F("ASE: Skipping unknown map type: ", temp);
                    parsePath = false;
                }
                continue;
            }
            // path to the texture
            if (parsePath && TokenMatch(filePtr,"BITMAP" ,6))
            {
                if(!ParseString(map.mMapName,"*BITMAP"))
                    SkipToNextToken();

                if (map.mMapName == "None")
                {
                    // Files with 'None' as map name are produced by
                    // an Maja to ASE exporter which name I forgot ..
                    ASSIMP_LOG_WARN("ASE: Skipping invalid map entry");
                    map.mMapName = "";
                }

                continue;
            }
            // offset on the u axis
            if (TokenMatch(filePtr,"UVW_U_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetU);
                continue;
            }
            // offset on the v axis
            if (TokenMatch(filePtr,"UVW_V_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetV);
                continue;
            }
            // tiling on the u axis
            if (TokenMatch(filePtr,"UVW_U_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleU);
                continue;
            }
            // tiling on the v axis
            if (TokenMatch(filePtr,"UVW_V_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleV);
                continue;
            }
            // rotation around the z-axis
            if (TokenMatch(filePtr,"UVW_ANGLE" ,9))
            {
                ParseLV4MeshFloat(map.mRotation);
                continue;
            }
            // map blending factor
            if (TokenMatch(filePtr,"MAP_AMOUNT" ,10))
            {
                ParseLV4MeshFloat(map.mTextureBlend);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MAP_XXXXXX");
    }
    return;
}